

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall anon_unknown.dwarf_57d50e7::BIP32PubkeyProvider::Clone(BIP32PubkeyProvider *this)

{
  undefined1 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  _func_int **pp_Var4;
  long lVar5;
  long in_RSI;
  undefined4 *puVar6;
  undefined4 *puVar7;
  pointer __p;
  long in_FS_OFFSET;
  byte bVar8;
  __uniq_ptr_impl<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
  local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  long local_30;
  
  bVar8 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pp_Var4 = (_func_int **)operator_new(0xa0);
  uVar2 = *(undefined4 *)(in_RSI + 8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_48,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RSI + 0x80));
  uVar3 = *(undefined4 *)(in_RSI + 0x98);
  uVar1 = *(undefined1 *)(in_RSI + 0x9c);
  *(undefined4 *)(pp_Var4 + 1) = uVar2;
  *pp_Var4 = (_func_int *)&PTR__BIP32PubkeyProvider_013bbdf0;
  puVar6 = (undefined4 *)(in_RSI + 0xc);
  puVar7 = (undefined4 *)((long)pp_Var4 + 0xc);
  for (lVar5 = 0x1d; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  pp_Var4[0x10] =
       (_func_int *)
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  pp_Var4[0x11] =
       (_func_int *)
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  pp_Var4[0x12] =
       (_func_int *)
       local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)(pp_Var4 + 0x13) = uVar3;
  *(undefined1 *)((long)pp_Var4 + 0x9c) = uVar1;
  local_50._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::BIP32PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
  .super__Head_base<0UL,_(anonymous_namespace)::BIP32PubkeyProvider_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::BIP32PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
        )(_Tuple_impl<0UL,_(anonymous_namespace)::BIP32PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
          )0x0;
  (this->super_PubkeyProvider)._vptr_PubkeyProvider = pp_Var4;
  std::
  unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::BIP32PubkeyProvider,_std::default_delete<(anonymous_namespace)::BIP32PubkeyProvider>_>
                 *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> Clone() const override
    {
        return std::make_unique<BIP32PubkeyProvider>(m_expr_index, m_root_extkey, m_path, m_derive, m_apostrophe);
    }